

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O1

Vec_Str_t * Gia_WritePacking(Vec_Int_t *vPacking)

{
  int *piVar1;
  char *pcVar2;
  Vec_Str_t *pVVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  
  lVar8 = (long)vPacking->nSize;
  pcVar2 = (char *)malloc(lVar8 * 4);
  if (0 < lVar8) {
    piVar1 = vPacking->pArray;
    lVar5 = 0;
    do {
      iVar6 = piVar1[lVar5];
      pcVar7 = pcVar2 + lVar5 * 4;
      iVar4 = 0x18;
      do {
        *pcVar7 = (char)(iVar6 >> ((byte)iVar4 & 0x1f));
        pcVar7 = pcVar7 + 1;
        iVar4 = iVar4 + -8;
      } while (iVar4 != -8);
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar8);
  }
  pVVar3 = (Vec_Str_t *)malloc(0x10);
  iVar6 = (int)(lVar8 * 4);
  pVVar3->nSize = iVar6;
  pVVar3->nCap = iVar6;
  pVVar3->pArray = pcVar2;
  return pVVar3;
}

Assistant:

Vec_Str_t * Gia_WritePacking( Vec_Int_t * vPacking )
{
    unsigned char * pBuffer = ABC_ALLOC( unsigned char, 4*Vec_IntSize(vPacking) );
    int i, Entry, nSize = 0;
    Vec_IntForEachEntry( vPacking, Entry, i )
        Gia_AigerWriteInt( pBuffer + 4 * nSize++, Entry );
    return Vec_StrAllocArray( (char *)pBuffer, 4*Vec_IntSize(vPacking) );
}